

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O1

size_t HIST_count_parallel_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,
                 HIST_checkInput_e check,U32 *workSpace)

{
  byte *pbVar1;
  int *piVar2;
  bool bVar3;
  U32 s;
  byte *pbVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  byte *pbVar10;
  size_t __n;
  size_t sVar11;
  
  __n = (ulong)(*maxSymbolValuePtr + 1) << 2;
  if (sourceSize == 0) {
    sVar11 = 0;
    memset(count,0,__n);
    *maxSymbolValuePtr = 0;
  }
  else {
    pbVar1 = (byte *)((long)source + sourceSize);
    memset(workSpace,0,0x1000);
    if (0x13 < (long)sourceSize) {
      pbVar4 = (byte *)((sourceSize - 0xf) + (long)source);
      uVar8 = *source;
      pbVar9 = (byte *)source;
      do {
        uVar7 = *(uint *)(pbVar9 + 4);
        workSpace[uVar8 & 0xff] = workSpace[uVar8 & 0xff] + 1;
        workSpace[(ulong)(uVar8 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar8 >> 8 & 0xff) + 0x100] + 1;
        piVar2 = (int *)((long)workSpace + (ulong)(uVar8 >> 0xe & 0x3fc) + 0x800);
        *piVar2 = *piVar2 + 1;
        workSpace[(ulong)(uVar8 >> 0x18) + 0x300] = workSpace[(ulong)(uVar8 >> 0x18) + 0x300] + 1;
        uVar8 = *(uint *)(pbVar9 + 8);
        workSpace[uVar7 & 0xff] = workSpace[uVar7 & 0xff] + 1;
        workSpace[(ulong)(uVar7 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar7 >> 8 & 0xff) + 0x100] + 1;
        piVar2 = (int *)((long)workSpace + (ulong)(uVar7 >> 0xe & 0x3fc) + 0x800);
        *piVar2 = *piVar2 + 1;
        workSpace[(ulong)(uVar7 >> 0x18) + 0x300] = workSpace[(ulong)(uVar7 >> 0x18) + 0x300] + 1;
        uVar7 = *(uint *)(pbVar9 + 0xc);
        workSpace[uVar8 & 0xff] = workSpace[uVar8 & 0xff] + 1;
        workSpace[(ulong)(uVar8 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar8 >> 8 & 0xff) + 0x100] + 1;
        piVar2 = (int *)((long)workSpace + (ulong)(uVar8 >> 0xe & 0x3fc) + 0x800);
        *piVar2 = *piVar2 + 1;
        workSpace[(ulong)(uVar8 >> 0x18) + 0x300] = workSpace[(ulong)(uVar8 >> 0x18) + 0x300] + 1;
        uVar8 = *(uint *)(pbVar9 + 0x10);
        workSpace[uVar7 & 0xff] = workSpace[uVar7 & 0xff] + 1;
        workSpace[(ulong)(uVar7 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar7 >> 8 & 0xff) + 0x100] + 1;
        piVar2 = (int *)((long)workSpace + (ulong)(uVar7 >> 0xe & 0x3fc) + 0x800);
        *piVar2 = *piVar2 + 1;
        workSpace[(ulong)(uVar7 >> 0x18) + 0x300] = workSpace[(ulong)(uVar7 >> 0x18) + 0x300] + 1;
        source = pbVar9 + 0x10;
        pbVar10 = pbVar9 + 0x14;
        pbVar9 = (byte *)source;
      } while (pbVar10 < pbVar4);
    }
    for (; source < pbVar1; source = (void *)((long)source + 1)) {
      workSpace[*source] = workSpace[*source] + 1;
    }
    lVar5 = 0;
    uVar8 = 0;
    do {
      uVar7 = workSpace[lVar5 + 0x200] + workSpace[lVar5 + 0x100] + workSpace[lVar5 + 0x300] +
              workSpace[lVar5];
      workSpace[lVar5] = uVar7;
      if (uVar7 <= uVar8) {
        uVar7 = uVar8;
      }
      uVar8 = uVar7;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
    uVar6 = 0x100;
    do {
      uVar7 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar7;
    } while (workSpace[uVar6] == 0);
    if ((check == trustInput) || (uVar7 <= *maxSymbolValuePtr)) {
      *maxSymbolValuePtr = uVar7;
      memmove(count,workSpace,__n);
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    sVar11 = 0xffffffffffffffd0;
    if (bVar3) {
      sVar11 = (ulong)uVar8;
    }
  }
  return sVar11;
}

Assistant:

static size_t HIST_count_parallel_wksp(
                                unsigned* count, unsigned* maxSymbolValuePtr,
                                const void* source, size_t sourceSize,
                                HIST_checkInput_e check,
                                U32* const workSpace)
{
    const BYTE* ip = (const BYTE*)source;
    const BYTE* const iend = ip+sourceSize;
    size_t const countSize = (*maxSymbolValuePtr + 1) * sizeof(*count);
    unsigned max=0;
    U32* const Counting1 = workSpace;
    U32* const Counting2 = Counting1 + 256;
    U32* const Counting3 = Counting2 + 256;
    U32* const Counting4 = Counting3 + 256;

    /* safety checks */
    assert(*maxSymbolValuePtr <= 255);
    if (!sourceSize) {
        ZSTD_memset(count, 0, countSize);
        *maxSymbolValuePtr = 0;
        return 0;
    }
    ZSTD_memset(workSpace, 0, 4*256*sizeof(unsigned));

    /* by stripes of 16 bytes */
    {   U32 cached = MEM_read32(ip); ip += 4;
        while (ip < iend-15) {
            U32 c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
        }
        ip-=4;
    }

    /* finish last symbols */
    while (ip<iend) Counting1[*ip++]++;

    {   U32 s;
        for (s=0; s<256; s++) {
            Counting1[s] += Counting2[s] + Counting3[s] + Counting4[s];
            if (Counting1[s] > max) max = Counting1[s];
    }   }

    {   unsigned maxSymbolValue = 255;
        while (!Counting1[maxSymbolValue]) maxSymbolValue--;
        if (check && maxSymbolValue > *maxSymbolValuePtr) return ERROR(maxSymbolValue_tooSmall);
        *maxSymbolValuePtr = maxSymbolValue;
        ZSTD_memmove(count, Counting1, countSize);   /* in case count & Counting1 are overlapping */
    }
    return (size_t)max;
}